

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

void __thiscall
MovParsedH264TrackData::extractData
          (MovParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte bVar1;
  pointer pvVar2;
  pointer __src;
  uint uVar3;
  uint8_t *puVar4;
  iterator __begin2;
  pointer pvVar5;
  uint8_t *puVar6;
  ulong __n;
  
  puVar4 = pkt->data;
  pvVar5 = (this->spsPpsList).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->spsPpsList).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar2) {
    do {
      puVar4[0] = '\0';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\x01';
      __src = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
      memcpy(puVar4 + 4,__src,
             (long)(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      puVar4 = puVar4 + (long)((pvVar5->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish +
                              (4 - (long)(pvVar5->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_start));
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != pvVar2);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_M_erase_at_end(&this->spsPpsList,
                      (this->spsPpsList).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < size) {
    puVar6 = buff + size;
    do {
      uVar3 = getNalSize(this,buff);
      bVar1 = this->nal_length_size;
      puVar4[0] = '\0';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\x01';
      __n = (ulong)uVar3;
      memcpy(puVar4 + 4,buff + bVar1,__n);
      puVar4 = puVar4 + __n + 4;
      buff = buff + bVar1 + __n;
    } while (buff < puVar6);
  }
  return;
}

Assistant:

void extractData(AVPacket* pkt, uint8_t* buff, const int size) override
    {
        uint8_t* dst = pkt->data;
        if (!spsPpsList.empty())
        {
            for (auto& i : spsPpsList)
            {
                *dst++ = 0x0;
                *dst++ = 0x0;
                *dst++ = 0x0;
                *dst++ = 0x1;

                memcpy(dst, i.data(), i.size());
                dst += i.size();
            }
            spsPpsList.clear();
        }
        const uint8_t* end = buff + size;
        while (buff < end)
        {
            const uint32_t nalSize = getNalSize(buff);
            buff += nal_length_size;
            *dst++ = 0x00;
            *dst++ = 0x00;
            *dst++ = 0x00;
            *dst++ = 0x01;
            memcpy(dst, buff, nalSize);
            dst += nalSize;
            buff += nalSize;
        }
    }